

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O0

void gf256_explog_init(void)

{
  uint uVar1;
  uint jj_2;
  uint jj_1;
  uint next;
  uint jj;
  uint16_t *logtab;
  uint8_t *exptab;
  uint poly;
  
  uVar1 = GF256Ctx.Polynomial;
  GF256Ctx.GF256_LOG_TABLE[0] = 0x200;
  GF256Ctx.GF256_EXP_TABLE[0] = '\x01';
  for (jj = 1; jj < 0xff; jj = jj + 1) {
    next = (uint)GF256Ctx.GF256_EXP_TABLE[jj - 1] << 1;
    if (0xff < next) {
      next = uVar1 ^ next;
    }
    GF256Ctx.GF256_EXP_TABLE[jj] = (uint8_t)next;
    GF256Ctx.GF256_LOG_TABLE[GF256Ctx.GF256_EXP_TABLE[jj]] = (uint16_t)jj;
  }
  GF256Ctx.GF256_EXP_TABLE[0xff] = GF256Ctx.GF256_EXP_TABLE[0];
  GF256Ctx.GF256_LOG_TABLE[GF256Ctx.GF256_EXP_TABLE[0]] = 0xff;
  for (jj_1 = 0x100; jj_1 < 0x1fe; jj_1 = jj_1 + 1) {
    GF256Ctx.GF256_EXP_TABLE[jj_1] = GF256Ctx.GF256_EXP_TABLE[(ulong)jj_1 % 0xff];
  }
  GF256Ctx.GF256_EXP_TABLE[0x1fe] = '\x01';
  for (jj_2 = 0x1ff; jj_2 < 0x3fc; jj_2 = jj_2 + 1) {
    GF256Ctx.GF256_EXP_TABLE[jj_2] = '\0';
  }
  return;
}

Assistant:

static void gf256_explog_init()
{
    unsigned poly = GF256Ctx.Polynomial;
    uint8_t* exptab = GF256Ctx.GF256_EXP_TABLE;
    uint16_t* logtab = GF256Ctx.GF256_LOG_TABLE;

    logtab[0] = 512;
    exptab[0] = 1;
    for (unsigned jj = 1; jj < 255; ++jj)
    {
        unsigned next = (unsigned)exptab[jj - 1] * 2;
        if (next >= 256)
            next ^= poly;

        exptab[jj] = static_cast<uint8_t>( next );
        logtab[exptab[jj]] = static_cast<uint16_t>( jj );
    }
    exptab[255] = exptab[0];
    logtab[exptab[255]] = 255;
    for (unsigned jj = 256; jj < 2 * 255; ++jj)
        exptab[jj] = exptab[jj % 255];
    exptab[2 * 255] = 1;
    for (unsigned jj = 2 * 255 + 1; jj < 4 * 255; ++jj)
        exptab[jj] = 0;
}